

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

JsonObjectWriter * __thiscall Catch::JsonReporter::startObject(JsonReporter *this)

{
  reference pvVar1;
  JsonObjectWriter *in_RDI;
  JsonObjectWriter *this_00;
  JsonArrayWriter local_20;
  
  this_00 = (JsonObjectWriter *)&in_RDI[6].m_indent_level;
  std::
  stack<Catch::JsonArrayWriter,_std::deque<Catch::JsonArrayWriter,_std::allocator<Catch::JsonArrayWriter>_>_>
  ::top((stack<Catch::JsonArrayWriter,_std::deque<Catch::JsonArrayWriter,_std::allocator<Catch::JsonArrayWriter>_>_>
         *)0x1a36ec);
  JsonArrayWriter::writeObject(&local_20);
  std::
  stack<Catch::JsonObjectWriter,_std::deque<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>_>
  ::emplace<Catch::JsonObjectWriter>
            ((stack<Catch::JsonObjectWriter,_std::deque<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>_>
              *)this_00,in_RDI);
  JsonObjectWriter::~JsonObjectWriter(this_00);
  std::
  stack<Catch::JsonReporter::Writer,_std::deque<Catch::JsonReporter::Writer,_std::allocator<Catch::JsonReporter::Writer>_>_>
  ::emplace<Catch::JsonReporter::Writer>
            ((stack<Catch::JsonReporter::Writer,_std::deque<Catch::JsonReporter::Writer,_std::allocator<Catch::JsonReporter::Writer>_>_>
              *)this_00,(Writer *)in_RDI);
  pvVar1 = std::
           stack<Catch::JsonObjectWriter,_std::deque<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>_>
           ::top((stack<Catch::JsonObjectWriter,_std::deque<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>_>
                  *)0x1a3746);
  return pvVar1;
}

Assistant:

JsonObjectWriter& JsonReporter::startObject() {
        m_objectWriters.emplace( m_arrayWriters.top().writeObject() );
        m_writers.emplace( Writer::Object );
        return m_objectWriters.top();
    }